

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_session.hpp
# Opt level: O1

response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
* __thiscall
m2d::savanna::url_session::
send_request<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
          (response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *__return_storage_ptr__,url_session *this,request<get_yahoo_endpoint> *request)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this_00;
  SSL *ssl;
  ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
  *stream;
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  *stream_00;
  undefined1 *puVar10;
  element_type *peVar11;
  _Base_ptr p_Var12;
  tuple<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
  next_layer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar13;
  dummy_u *pdVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 uVar17;
  char cVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  runtime_error *prVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  bool bVar26;
  error_code ec;
  results_type results;
  url url;
  data_union local_438;
  response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  string local_408;
  results_type local_3e8;
  url local_3d0;
  url local_310;
  request<get_yahoo_endpoint> local_250;
  request<get_yahoo_endpoint> local_1a8;
  error_code local_100;
  url local_f0;
  
  local_418 = __return_storage_ptr__;
  endpoint::url(&local_3d0,(endpoint *)&request->endpoint);
  this_00 = (this->resolver_).
            super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  puVar4 = (undefined1 *)((long)&local_438.v6.sin6_addr.__in6_u + 8);
  local_438._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,local_3d0.host_._M_dataplus._M_p,
             local_3d0.host_._M_dataplus._M_p + local_3d0.host_._M_string_length);
  savanna::url::port_str_abi_cxx11_(&local_408,&local_3d0);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve(&local_3e8,this_00,(string *)&local_438.base,&local_408,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_408._M_dataplus._M_p._4_4_,(int)local_408._M_dataplus._M_p) !=
      &local_408.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_408._M_dataplus._M_p._4_4_,(int)local_408._M_dataplus._M_p));
  }
  if ((undefined1 *)local_438._0_8_ != puVar4) {
    operator_delete((void *)local_438._0_8_);
  }
  local_438._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,local_3d0.scheme_._M_dataplus._M_p,
             local_3d0.scheme_._M_dataplus._M_p + local_3d0.scheme_._M_string_length);
  if (local_438.v4.sin_zero == DAT_0021aa40) {
    if (local_438.v4.sin_zero == (uchar  [8])0x0) {
      bVar26 = true;
    }
    else {
      iVar19 = bcmp((void *)local_438._0_8_,url_scheme::https_abi_cxx11_,
                    (size_t)local_438.v4.sin_zero);
      bVar26 = iVar19 == 0;
    }
  }
  else {
    bVar26 = false;
  }
  if ((undefined1 *)local_438._0_8_ != puVar4) {
    operator_delete((void *)local_438._0_8_);
  }
  if (!bVar26) {
    boost::beast::
    basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
    ::connect<boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,void>
              ((endpoint *)&local_438.base,
               (basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
                *)(this->tcp_stream_).
                  super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_3e8);
    stream_00 = (this->tcp_stream_).
                super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    savanna::url::url(&local_f0,&local_3d0);
    local_250.follow_location = request->follow_location;
    local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
    if ((request->endpoint).super_get_endpoint.query_.super_type.m_initialized == true) {
      local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ =
           (long)&local_250.endpoint.super_get_endpoint.query_.super_type.m_storage + 8;
      local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ =
           *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                            dummy_ + 0x10);
      if (local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ == 0) {
        pdVar14 = &local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ = 0;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ = 0;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
             local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
      }
      else {
        puVar4 = (undefined1 *)
                 ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
                 8);
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ =
             *(undefined4 *)
              ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8)
        ;
        puVar10 = *(undefined1 **)
                   ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_
                   + 0x18);
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
             *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                              dummy_ + 0x20);
        *(undefined8 *)
         (local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ + 8) =
             local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
        pdVar14 = &(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._40_8_ =
             *(undefined8 *)
              ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
              0x28);
        *(undefined8 *)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x10) =
             0;
        *(undefined1 **)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x18) =
             puVar4;
        *(undefined1 **)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x20) =
             puVar4;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ = puVar10;
      }
      *(undefined8 *)((long)pdVar14 + 0x28) = 0;
      local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = true;
    }
    paVar5 = &local_250.body.field_2;
    local_250.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
         (_func_int **)&PTR_scheme_abi_cxx11__00218168;
    local_250.version = request->version;
    local_250.body._M_dataplus._M_p = (request->body)._M_dataplus._M_p;
    paVar1 = &(request->body).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.body._M_dataplus._M_p == paVar1) {
      local_250.body.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_250.body.field_2._8_8_ = *(undefined8 *)((long)&(request->body).field_2 + 8);
      local_250.body._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_250.body.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_250.body._M_string_length = (request->body)._M_string_length;
    local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header;
    (request->body)._M_dataplus._M_p = (pointer)paVar1;
    (request->body)._M_string_length = 0;
    (request->body).field_2._M_local_buf[0] = '\0';
    local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      pmVar13 = &local_250.header_fields;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var2 = &(request->header_fields)._M_t._M_impl.super__Rb_tree_header;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      p_Var12 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar13 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&(request->header_fields)._M_t._M_impl;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var12;
    }
    *(size_t *)((long)&(pmVar13->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
    local_250.timeout_interval.__r = (request->timeout_interval).__r;
    send_request<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
              (local_418,this,stream_00,&local_f0,&local_250);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_250.header_fields._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.body._M_dataplus._M_p != paVar5) {
      operator_delete(local_250.body._M_dataplus._M_p);
    }
    local_250.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
         (_func_int **)&PTR_scheme_abi_cxx11__00218200;
    if (local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized == true) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_250.endpoint.super_get_endpoint.query_.super_type.m_storage);
      local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.fragment_._M_dataplus._M_p != &local_f0.fragment_.field_2) {
      operator_delete(local_f0.fragment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.query_._M_dataplus._M_p != &local_f0.query_.field_2) {
      operator_delete(local_f0.query_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.path_._M_dataplus._M_p != &local_f0.path_.field_2) {
      operator_delete(local_f0.path_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.port_._M_dataplus._M_p != &local_f0.port_.field_2) {
      operator_delete(local_f0.port_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.host_._M_dataplus._M_p != &local_f0.host_.field_2) {
      operator_delete(local_f0.host_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.scheme_._M_dataplus._M_p != &local_f0.scheme_.field_2) {
      operator_delete(local_f0.scheme_._M_dataplus._M_p);
    }
    boost::system::error_code::error_code((error_code *)&local_438.base);
    peVar11 = (((this->tcp_stream_).
                super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->impl_).px;
    if (peVar11 == (element_type *)0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type>::operator->() const [T = boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type]"
                   );
    }
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
              ((peVar11->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,(int)peVar11 + 0x18,2);
    if (local_438.base.sa_data[2] == '\x01') {
      boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                ((error_condition *)&local_408,not_connected,(type *)0x0);
      cVar18 = (**(code **)(*(long *)local_438.v4.sin_zero + 0x10))
                         (local_438.v4.sin_zero,local_438._0_8_ & 0xffffffff,&local_408);
      if (cVar18 == '\0') {
        cVar18 = (**(code **)(*(long *)local_408._M_string_length + 0x18))
                           (local_408._M_string_length,&local_438,(int)local_408._M_dataplus._M_p);
        if (cVar18 == '\0') {
          prVar23 = (runtime_error *)__cxa_allocate_exception(0x40);
          uVar15 = local_438._0_8_;
          std::runtime_error::runtime_error(prVar23,"");
          *(undefined ***)prVar23 = &PTR__system_error_00217f48;
          *(undefined8 *)(prVar23 + 0x10) = uVar15;
          *(uchar (*) [8])(prVar23 + 0x18) = local_438.v4.sin_zero;
          *(runtime_error **)(prVar23 + 0x20) = prVar23 + 0x30;
          *(undefined8 *)(prVar23 + 0x28) = 0;
          prVar23[0x30] = (runtime_error)0x0;
          __cxa_throw(prVar23,&boost::system::system_error::typeinfo,
                      boost::system::system_error::~system_error);
        }
      }
    }
    goto LAB_0011feee;
  }
  ssl = *(SSL **)((long)(((this->ssl_stream_).
                          super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->p_)._M_t.
                        super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                 + 0x10);
  local_438._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,local_3d0.host_._M_dataplus._M_p,
             local_3d0.host_._M_dataplus._M_p + local_3d0.host_._M_string_length);
  lVar20 = SSL_ctrl(ssl,0x37,0,(void *)local_438._0_8_);
  if ((undefined1 *)local_438._0_8_ != puVar4) {
    operator_delete((void *)local_438._0_8_);
  }
  if (lVar20 == 0) {
    uVar21 = ERR_get_error();
    if (boost::asio::error::get_ssl_category()::instance == '\0') {
      send_request<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
                ();
    }
    uVar17 = (**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                       (&boost::asio::error::get_ssl_category()::instance,uVar21 & 0xffffffff);
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_410._1_7_,uVar17);
    boost::system::error_code::error_code<boost::asio::ssl::error::stream_errors>
              ((error_code *)&local_438.base,stream_truncated,(type *)0x0);
    if (local_438._0_4_ != (int)uVar21) {
LAB_0011ffb4:
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x40);
      std::runtime_error::runtime_error(prVar23,"");
      *(undefined ***)prVar23 = &PTR__system_error_00217f48;
      *(ulong *)(prVar23 + 0x10) = ((ulong)local_410 & 0xff) << 0x20 | uVar21 & 0xffffffff;
      *(long **)(prVar23 + 0x18) = &boost::asio::error::get_ssl_category()::instance;
      *(runtime_error **)(prVar23 + 0x20) = prVar23 + 0x30;
      *(undefined8 *)(prVar23 + 0x28) = 0;
      prVar23[0x30] = (runtime_error)0x0;
      __cxa_throw(prVar23,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    bVar26 = DAT_0021ac00 != *(long *)((long)local_438.v4.sin_zero + 8);
    if (*(long *)((long)local_438.v4.sin_zero + 8) == 0) {
      bVar26 = local_438.v4.sin_zero !=
               (uchar  [8])&boost::asio::error::get_ssl_category()::instance;
    }
    if (bVar26) goto LAB_0011ffb4;
  }
  boost::beast::
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  ::expires_after((basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
                   *)(((this->ssl_stream_).
                       super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->p_)._M_t.
                     super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                  ,(duration)(request->timeout_interval).__r);
  boost::beast::
  basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
  ::connect<boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,void>
            ((endpoint *)&local_438.base,
             (basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
              *)(((this->ssl_stream_).
                  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->p_)._M_t.
                super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
             ,&local_3e8);
  boost::asio::ssl::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
  ::handshake((stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
               *)(((this->ssl_stream_).
                   super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->p_)._M_t.
                 super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
              ,client);
  stream = (this->ssl_stream_).
           super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_310.scheme_._M_dataplus._M_p = (pointer)&local_310.scheme_.field_2;
  paVar1 = &local_3d0.scheme_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.scheme_._M_dataplus._M_p == paVar1) {
    local_310.scheme_.field_2._8_8_ = local_3d0.scheme_.field_2._8_8_;
  }
  else {
    local_310.scheme_._M_dataplus._M_p = local_3d0.scheme_._M_dataplus._M_p;
  }
  paVar5 = &local_3d0.host_.field_2;
  local_310.host_._M_dataplus._M_p = (pointer)&local_310.host_.field_2;
  local_310.scheme_._M_string_length = local_3d0.scheme_._M_string_length;
  local_3d0.scheme_._M_string_length = 0;
  local_3d0.scheme_.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.host_._M_dataplus._M_p == paVar5) {
    local_310.host_.field_2._8_8_ = local_3d0.host_.field_2._8_8_;
  }
  else {
    local_310.host_._M_dataplus._M_p = local_3d0.host_._M_dataplus._M_p;
  }
  paVar6 = &local_3d0.port_.field_2;
  local_310.port_._M_dataplus._M_p = (pointer)&local_310.port_.field_2;
  local_310.host_._M_string_length = local_3d0.host_._M_string_length;
  local_3d0.host_._M_string_length = 0;
  local_3d0.host_.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.port_._M_dataplus._M_p == paVar6) {
    local_310.port_.field_2._8_8_ = local_3d0.port_.field_2._8_8_;
  }
  else {
    local_310.port_._M_dataplus._M_p = local_3d0.port_._M_dataplus._M_p;
  }
  paVar7 = &local_3d0.path_.field_2;
  paVar8 = &local_310.path_.field_2;
  local_310.port_._M_string_length = local_3d0.port_._M_string_length;
  local_3d0.port_._M_string_length = 0;
  local_3d0.port_.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.path_._M_dataplus._M_p == paVar7) {
    local_310.path_.field_2._8_8_ = local_3d0.path_.field_2._8_8_;
    local_310.path_._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_310.path_._M_dataplus._M_p = local_3d0.path_._M_dataplus._M_p;
  }
  local_310.path_._M_string_length = local_3d0.path_._M_string_length;
  local_3d0.path_._M_string_length = 0;
  local_3d0.path_.field_2._M_local_buf[0] = '\0';
  local_410 = &local_310.query_.field_2;
  paVar22 = &local_3d0.query_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.query_._M_dataplus._M_p == paVar22) {
    local_310.query_.field_2._8_8_ = local_3d0.query_.field_2._8_8_;
    local_310.query_._M_dataplus._M_p = (pointer)local_410;
  }
  else {
    local_310.query_._M_dataplus._M_p = local_3d0.query_._M_dataplus._M_p;
  }
  local_310.query_._M_string_length = local_3d0.query_._M_string_length;
  local_3d0.query_._M_string_length = 0;
  local_3d0.query_.field_2._M_local_buf[0] = '\0';
  paVar24 = &local_310.fragment_.field_2;
  paVar25 = &local_3d0.fragment_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.fragment_._M_dataplus._M_p == paVar25) {
    local_310.fragment_.field_2._8_8_ = local_3d0.fragment_.field_2._8_8_;
    local_310.fragment_._M_dataplus._M_p = (pointer)paVar24;
  }
  else {
    local_310.fragment_._M_dataplus._M_p = local_3d0.fragment_._M_dataplus._M_p;
  }
  local_310.fragment_._M_string_length = local_3d0.fragment_._M_string_length;
  local_3d0.fragment_._M_string_length = 0;
  local_3d0.fragment_.field_2._M_local_buf[0] = '\0';
  local_1a8.follow_location = request->follow_location;
  local_1a8.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
  if ((request->endpoint).super_get_endpoint.query_.super_type.m_initialized == true) {
    local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ =
         (long)&local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage + 8;
    local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ =
         *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_
                  + 0x10);
    if (local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ == 0) {
      pdVar14 = &local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_;
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ = 0;
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ = 0;
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
           local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
    }
    else {
      puVar4 = (undefined1 *)
               ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8
               );
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ =
           *(undefined4 *)
            ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8);
      puVar10 = *(undefined1 **)
                 ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
                 0x18);
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
           *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                            dummy_ + 0x20);
      *(undefined8 *)
       (local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ + 8) =
           local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
      pdVar14 = &(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_;
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._40_8_ =
           *(undefined8 *)
            ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x28
            );
      *(undefined8 *)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x10) = 0
      ;
      *(undefined1 **)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x18) =
           puVar4;
      *(undefined1 **)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x20) =
           puVar4;
      local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ = puVar10;
    }
    *(undefined8 *)((long)pdVar14 + 0x28) = 0;
    local_1a8.endpoint.super_get_endpoint.query_.super_type.m_initialized = true;
  }
  paVar9 = &local_1a8.body.field_2;
  local_1a8.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
       (_func_int **)&PTR_scheme_abi_cxx11__00218168;
  local_1a8.version = request->version;
  local_1a8.body._M_dataplus._M_p = (request->body)._M_dataplus._M_p;
  paVar3 = &(request->body).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.body._M_dataplus._M_p == paVar3) {
    local_1a8.body.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1a8.body.field_2._8_8_ = *(undefined8 *)((long)&(request->body).field_2 + 8);
    local_1a8.body._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_1a8.body.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_1a8.body._M_string_length = (request->body)._M_string_length;
  local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  (request->body)._M_dataplus._M_p = (pointer)paVar3;
  (request->body)._M_string_length = 0;
  (request->body).field_2._M_local_buf[0] = '\0';
  local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (_Base_ptr)0x0) {
    pmVar13 = &local_1a8.header_fields;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var2 = &(request->header_fields)._M_t._M_impl.super__Rb_tree_header;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var12 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar13 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(request->header_fields)._M_t._M_impl;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    local_1a8.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var12;
  }
  *(size_t *)((long)&(pmVar13->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
  local_1a8.timeout_interval.__r = (request->timeout_interval).__r;
  local_3d0.scheme_._M_dataplus._M_p = (pointer)paVar1;
  local_3d0.host_._M_dataplus._M_p = (pointer)paVar5;
  local_3d0.port_._M_dataplus._M_p = (pointer)paVar6;
  local_3d0.path_._M_dataplus._M_p = (pointer)paVar7;
  local_3d0.query_._M_dataplus._M_p = (pointer)paVar22;
  local_3d0.fragment_._M_dataplus._M_p = (pointer)paVar25;
  send_request<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
            (local_418,this,stream,&local_310,&local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1a8.header_fields._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.body._M_dataplus._M_p != paVar9) {
    operator_delete(local_1a8.body._M_dataplus._M_p);
  }
  local_1a8.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
       (_func_int **)&PTR_scheme_abi_cxx11__00218200;
  if (local_1a8.endpoint.super_get_endpoint.query_.super_type.m_initialized == true) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1a8.endpoint.super_get_endpoint.query_.super_type.m_storage);
    local_1a8.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.fragment_._M_dataplus._M_p != paVar24) {
    operator_delete(local_310.fragment_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.query_._M_dataplus._M_p != local_410) {
    operator_delete(local_310.query_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.path_._M_dataplus._M_p != paVar8) {
    operator_delete(local_310.path_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.port_._M_dataplus._M_p != &local_310.port_.field_2) {
    operator_delete(local_310.port_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.host_._M_dataplus._M_p != &local_310.host_.field_2) {
    operator_delete(local_310.host_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.scheme_._M_dataplus._M_p != &local_310.scheme_.field_2) {
    operator_delete(local_310.scheme_._M_dataplus._M_p);
  }
  boost::system::error_code::error_code((error_code *)&local_438.base);
  next_layer.
  super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
  .
  super__Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
  ._M_head_impl =
       (((this->ssl_stream_).
         super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->p_)._M_t.
       super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
  ;
  boost::asio::ssl::detail::
  io<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::asio::ssl::detail::shutdown_op>
            ((basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
              *)next_layer.
                super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                .
                super__Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
                ._M_head_impl,
             (stream_core *)
             ((long)next_layer.
                    super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                    .
                    super__Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
                    ._M_head_impl + 0x10),(shutdown_op *)&local_408,(error_code *)&local_438.base);
  boost::system::error_code::error_code<boost::asio::error::misc_errors>
            ((error_code *)&local_408,eof,(type *)0x0);
  if (local_438._0_4_ == (int)local_408._M_dataplus._M_p) {
    bVar26 = *(long *)((long)local_438.v4.sin_zero + 8) == *(long *)(local_408._M_string_length + 8)
    ;
    if (*(long *)(local_408._M_string_length + 8) == 0) {
      bVar26 = local_438.v4.sin_zero == (uchar  [8])local_408._M_string_length;
    }
    if (!bVar26) goto LAB_0011fe45;
LAB_0011fe90:
    boost::system::error_code::error_code((error_code *)&local_408);
    local_438._0_8_ = CONCAT44(local_408._M_dataplus._M_p._4_4_,(int)local_408._M_dataplus._M_p);
    local_438.base.sa_data[6] = (undefined1)local_408._M_string_length;
    local_438.base.sa_data[7] = local_408._M_string_length._1_1_;
    local_438.base.sa_data[8] = local_408._M_string_length._2_1_;
    local_438.base.sa_data[9] = local_408._M_string_length._3_1_;
    local_438.base.sa_data[10] = local_408._M_string_length._4_1_;
    local_438.base.sa_data[0xb] = local_408._M_string_length._5_1_;
    local_438.base.sa_data[0xc] = local_408._M_string_length._6_1_;
    local_438.base.sa_data[0xd] = local_408._M_string_length._7_1_;
  }
  else {
LAB_0011fe45:
    boost::system::error_code::error_code<boost::asio::ssl::error::stream_errors>
              (&local_100,stream_truncated,(type *)0x0);
    if (local_438._0_4_ == local_100.val_) {
      bVar26 = *(long *)((long)local_438.v4.sin_zero + 8) == *(long *)((long)local_100.cat_ + 8);
      if (*(long *)((long)local_100.cat_ + 8) == 0) {
        bVar26 = local_438.v4.sin_zero == (uchar  [8])local_100.cat_;
      }
      if (bVar26) goto LAB_0011fe90;
    }
  }
  if (local_438.base.sa_data[2] == '\x01') {
    boost::system::error_condition::error_condition<boost::system::errc::errc_t>
              ((error_condition *)&local_408,not_connected,(type *)0x0);
    cVar18 = (**(code **)(*(long *)local_438.v4.sin_zero + 0x10))
                       (local_438.v4.sin_zero,local_438._0_8_ & 0xffffffff,&local_408);
    if (cVar18 == '\0') {
      cVar18 = (**(code **)(*(long *)local_408._M_string_length + 0x18))
                         (local_408._M_string_length,&local_438,(int)local_408._M_dataplus._M_p);
      if (cVar18 == '\0') {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x40);
        uVar16 = local_438.v4.sin_zero;
        uVar15 = local_438._0_8_;
        std::runtime_error::runtime_error(prVar23,"");
        *(undefined ***)prVar23 = &PTR__system_error_00217f48;
        *(undefined8 *)(prVar23 + 0x10) = uVar15;
        *(undefined8 *)(prVar23 + 0x18) = uVar16;
        *(runtime_error **)(prVar23 + 0x20) = prVar23 + 0x30;
        *(undefined8 *)(prVar23 + 0x28) = 0;
        prVar23[0x30] = (runtime_error)0x0;
        __cxa_throw(prVar23,&boost::system::system_error::typeinfo,
                    boost::system::system_error::~system_error);
      }
    }
  }
LAB_0011feee:
  if (local_3e8.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
               super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.fragment_._M_dataplus._M_p != &local_3d0.fragment_.field_2) {
    operator_delete(local_3d0.fragment_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.query_._M_dataplus._M_p != &local_3d0.query_.field_2) {
    operator_delete(local_3d0.query_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.path_._M_dataplus._M_p != &local_3d0.path_.field_2) {
    operator_delete(local_3d0.path_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.port_._M_dataplus._M_p != &local_3d0.port_.field_2) {
    operator_delete(local_3d0.port_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.host_._M_dataplus._M_p != &local_3d0.host_.field_2) {
    operator_delete(local_3d0.host_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.scheme_._M_dataplus._M_p != &local_3d0.scheme_.field_2) {
    operator_delete(local_3d0.scheme_._M_dataplus._M_p);
  }
  return local_418;
}

Assistant:

http::response<Body> send_request(savanna::request<Endpoint> request)
		{
			auto url = request.endpoint.url();
			auto const results = resolver_->resolve(url.host(), url.port_str());
			if (url.scheme() == url_scheme::https) {
				if (!SSL_set_tlsext_host_name(ssl_stream_->native_handle(), url.host().c_str())) {
					beast::error_code ec { static_cast<int>(::ERR_get_error()), net::error::get_ssl_category() };
					if (ec != net::ssl::error::stream_truncated) {
						throw beast::system_error { ec };
					}
				}

				beast::get_lowest_layer(*ssl_stream_).expires_after(request.timeout_interval);
				beast::get_lowest_layer(*ssl_stream_).connect(results);

				// Perform the SSL handshake
				ssl_stream_->handshake(ssl::stream_base::client);

				auto response = send_request<beast::ssl_stream<beast::tcp_stream>, Body, Endpoint>(*ssl_stream_, std::move(url), std::move(request));

				beast::error_code ec;
				ssl_stream_->shutdown(ec);

				if (ec == net::error::eof || ec == net::ssl::error::stream_truncated) {
					// Rationale:
					// http://stackoverflow.com/questions/25587403/boost-asio-ssl-async-shutdown-always-finishes-with-an-error
					// https://github.com/boostorg/beast/blob/master/example/http/server/async-ssl/http_server_async_ssl.cpp#L216
					ec = {};
				}

				if (ec && ec != beast::errc::not_connected) {
					// not_connected happens sometimes
					// so don't bother reporting it.
					throw beast::system_error { ec };
				}

				return response;
			}
			else {
				tcp_stream_->connect(results);
				auto response = send_request<beast::tcp_stream, Body, Endpoint>(*tcp_stream_, url, std::move(request));

				beast::error_code ec;
				tcp_stream_->socket().shutdown(tcp::socket::shutdown_both, ec);

				if (ec && ec != beast::errc::not_connected) {
					// not_connected happens sometimes
					// so don't bother reporting it.
					throw beast::system_error { ec };
				}
				return response;
			}
		}